

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

S2Point * S2LatLngRect::GetBisectorIntersection
                    (S2Point *__return_storage_ptr__,R1Interval *lat,double lng)

{
  double dVar1;
  S2LatLng ortho_bisector;
  S2LatLng local_38;
  S2Point local_28;
  
  dVar1 = ((lat->bounds_).c_[0] + (lat->bounds_).c_[1]) * 0.5;
  if (dVar1 < 0.0) {
    local_38.coords_.c_[0] = -1.5707963267948966 - dVar1;
  }
  else {
    local_38.coords_.c_[0] = dVar1 + -1.5707963267948966;
  }
  local_38.coords_.c_[1] =
       (VType)(~-(ulong)(dVar1 < 0.0) & (ulong)ABS(lng) |
              (ulong)(ABS(lng) + -3.141592653589793) & -(ulong)(dVar1 < 0.0));
  if (GetBisectorIntersection(R1Interval_const&,double)::ortho_lng == '\0') {
    GetBisectorIntersection();
  }
  S2LatLng::ToPoint(&local_28,&local_38);
  S2::RobustCrossProd(__return_storage_ptr__,&GetBisectorIntersection::ortho_lng,&local_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2LatLngRect::GetBisectorIntersection(const R1Interval& lat,
                                              double lng) {
  lng = fabs(lng);
  double lat_center = lat.GetCenter();
  // A vector orthogonal to the bisector of the given longitudinal edge.
  S2LatLng ortho_bisector;
  if (lat_center >= 0) {
    ortho_bisector = S2LatLng::FromRadians(lat_center - M_PI_2, lng);
  } else {
    ortho_bisector = S2LatLng::FromRadians(-lat_center - M_PI_2, lng - M_PI);
  }
  // A vector orthogonal to longitude 0.
  static const S2Point ortho_lng = S2Point(0, -1, 0);
  return S2::RobustCrossProd(ortho_lng, ortho_bisector.ToPoint());
}